

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

shared_ptr<char> __thiscall QUtil::make_shared_cstr(QUtil *this,string *str)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<char> sVar1;
  
  make_shared_array<char>(this,str->_M_string_length + 1);
  *(undefined1 *)(*(long *)this + str->_M_string_length) = 0;
  memcpy(*(void **)this,(str->_M_dataplus)._M_p,str->_M_string_length);
  sVar1.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<char>)sVar1.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<char>
QUtil::make_shared_cstr(std::string const& str)
{
    auto result = QUtil::make_shared_array<char>(str.length() + 1);
    // Use memcpy in case string contains nulls
    result.get()[str.length()] = '\0';
    memcpy(result.get(), str.c_str(), str.length());
    return result;
}